

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::backward::NeHelper<false>::
Compare<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,NeHelper<false> *this,char *expr1,char *expr2,
          iu_basic_string_view<char,_std::char_traits<char>_> *val1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  
  bVar1 = iuOperatorNE<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                    ((iu_basic_string_view<char,_std::char_traits<char>_> *)expr2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val1);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    CmpHelperOpFailure<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (__return_storage_ptr__,(internal *)this,expr1,"!=",expr2,val1,unaff_RBX);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T1& val1, const T2& val2)
    {
        return CmpHelperNE(expr1, expr2, val1, val2);
    }